

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TLaplaceExampleTimeDependent::Permeability<Fad<double>>
          (TLaplaceExampleTimeDependent *this,TPZVec<Fad<double>_> *x,Fad<double> *Perm)

{
  Fad<double> *in_stack_ffffffffffffffa8;
  Fad<double> *this_00;
  double *in_stack_ffffffffffffffb8;
  Fad<double> *in_stack_ffffffffffffffc0;
  Fad<double> local_38;
  
  this_00 = &local_38;
  Fad<double>::Fad<double,_nullptr>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Fad<double>::operator=(this_00,in_stack_ffffffffffffffa8);
  Fad<double>::~Fad(this_00);
  return;
}

Assistant:

void TLaplaceExampleTimeDependent::Permeability(const TPZVec<TVar> &x, TVar &Perm) const
{
    Perm = (TVar)(fK);
}